

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings_pack.cpp
# Opt level: O3

string * __thiscall libtorrent::settings_pack::get_str_abi_cxx11_(settings_pack *this,int name)

{
  pointer ppVar1;
  string *psVar2;
  pointer ppVar3;
  difference_type __d;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (get_str[abi:cxx11](int)::empty_abi_cxx11_ == '\0') {
    get_str_abi_cxx11_();
  }
  if ((name & 0xc000U) == 0) {
    ppVar3 = (this->m_strings).
             super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar1 = (this->m_strings).
             super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar4 = (long)ppVar1 - (long)ppVar3;
    if (uVar4 == 0x208) {
      psVar2 = &ppVar3[name & 0x3fff].second;
    }
    else {
      if (0 < (long)uVar4) {
        uVar4 = (uVar4 >> 3) * -0x3333333333333333;
        do {
          uVar5 = uVar4 >> 1;
          uVar6 = uVar5;
          if (ppVar3[uVar5].first < (ushort)name) {
            uVar6 = ~uVar5 + uVar4;
            ppVar3 = ppVar3 + uVar5 + 1;
          }
          uVar4 = uVar6;
        } while (0 < (long)uVar6);
      }
      if ((ppVar3 == ppVar1) || ((uint)ppVar3->first != name)) {
        psVar2 = (string *)(&DAT_004eef90 + (ulong)(name & 0x3fff) * 0x38);
      }
      else {
        psVar2 = &ppVar3->second;
      }
    }
  }
  else {
    psVar2 = &get_str[abi:cxx11](int)::empty_abi_cxx11_;
  }
  return psVar2;
}

Assistant:

std::string const& settings_pack::get_str(int name) const
	{
		static std::string const empty;
		TORRENT_ASSERT_PRECOND((name & type_mask) == string_type_base);
		if ((name & type_mask) != string_type_base) return empty;

		// this is an optimization. If the settings pack is complete,
		// i.e. has every key, we don't need to search, it's just a lookup
		if (m_strings.size() == settings_pack::num_string_settings)
		{
			TORRENT_ASSERT(m_strings[name & index_mask].first == name);
			return m_strings[name & index_mask].second;
		}
		std::pair<std::uint16_t, std::string> v(aux::numeric_cast<std::uint16_t>(name), std::string());
		auto i = std::lower_bound(m_strings.begin(), m_strings.end(), v
				, &compare_first<std::string>);
		if (i != m_strings.end() && i->first == name) return i->second;

		return str_settings[name & index_mask].default_value;
	}